

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# until-done.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  SaveBlock save;
  LoadBlock load_;
  int iVar1;
  _Manager_type p_Var2;
  time_t tVar3;
  undefined4 *b;
  Link *l;
  ostream *poVar4;
  int gid;
  int gid__;
  int iVar5;
  _Invoker_type p_Stack_18a8;
  environment env;
  communicator world;
  _Invoker_type local_1888;
  code *q_policy;
  code *local_1860 [2];
  code *local_1850;
  code *local_1848;
  code *local_1840 [2];
  code *local_1830;
  code *local_1828;
  code *local_1820 [2];
  code *local_1810;
  code *local_1808;
  communicator local_1800;
  _Any_data local_17e8;
  code *local_17d8;
  code *local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  code *local_17b8;
  code *local_17b0;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  code *local_1798;
  code *local_1790;
  undefined1 local_1788 [168];
  FileStorage storage;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  iVar1 = world.size_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"./DIY.XXXXXX",(allocator<char> *)local_1788);
  diy::FileStorage::FileStorage(&storage,(string *)&master);
  std::__cxx11::string::~string((string *)&master);
  local_1800.comm_.data = world.comm_.data;
  local_1800.owner_ = false;
  local_1820[1] = (code *)0x0;
  local_1820[0] = create_block;
  local_1808 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_1810 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_1840[1] = (code *)0x0;
  local_1840[0] = destroy_block;
  local_1828 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_1860[1] = (code *)0x0;
  local_1830 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_1860[0] = save_block;
  local_1848 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_invoke;
  local_1850 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_manager;
  q_policy = load_block;
  p_Var2 = (_Manager_type)operator_new(0x10);
  *(undefined ***)p_Var2 = &PTR_unload_incoming_0013d530;
  *(undefined8 *)(p_Var2 + 8) = 0x1000;
  save.super__Function_base._M_functor._8_8_ = &stack0xffffffffffffe780;
  save.super__Function_base._M_functor._M_unused._M_object = local_1860;
  save.super__Function_base._M_manager = p_Var2;
  save._M_invoker = p_Stack_18a8;
  load_.super__Function_base._M_functor._8_4_ = world.rank_;
  load_.super__Function_base._M_functor._M_unused._M_object = world.comm_.data;
  load_.super__Function_base._M_functor._12_4_ = world.size_;
  load_.super__Function_base._M_manager = (_Manager_type)world._16_8_;
  load_._M_invoker = local_1888;
  diy::Master::Master(&master,&local_1800,-1,2,(CreateBlock *)local_1820,(DestroyBlock *)local_1840,
                      &storage.super_ExternalStorage,save,load_,(QueuePolicy *)q_policy);
  iVar5 = iVar1 << 2;
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe780);
  std::_Function_base::~_Function_base((_Function_base *)local_1860);
  std::_Function_base::~_Function_base((_Function_base *)local_1840);
  std::_Function_base::~_Function_base((_Function_base *)local_1820);
  diy::mpi::communicator::~communicator(&local_1800);
  gid__ = 0;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  if (iVar1 << 2 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != gid__; gid__ = gid__ + 1) {
    if (gid__ % world.size_ == world.rank_) {
      b = (undefined4 *)operator_new(4);
      *b = 0;
      l = (Link *)operator_new(0x20);
      (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013d668;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      diy::Master::add(&master,gid__,b,l);
    }
  }
  do {
    local_1888 = flip_coin;
    local_1788._0_8_ = 0;
    local_1788._8_8_ = (Master *)0x0;
    local_1788._24_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_invoke;
    local_1788._16_8_ =
         std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
    ;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_1888,(Skip *)local_1788);
    std::_Function_base::~_Function_base((_Function_base *)local_1788);
    local_17e8._M_unused._M_object = (void *)0x0;
    local_17e8._8_8_ = 0;
    local_17d0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_17d8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_17c8 = 0;
    uStack_17c0 = 0;
    local_17b0 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_17b8 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_17a8 = 0;
    uStack_17a0 = 0;
    local_1790 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1798 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_17e8);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_17e8);
    iVar1 = diy::Collection::available(&master.blocks_);
    diy::Master::proxy((ProxyWithLink *)local_1788,&master,iVar1,(IExchangeInfo *)0x0);
    iVar1 = diy::Master::Proxy::read<int>((Proxy *)local_1788);
    diy::Master::Proxy::~Proxy((Proxy *)local_1788);
  } while (iVar1 == 0);
  if (world.rank_ == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total iterations: ");
    iVar1 = diy::Collection::available(&master.blocks_);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar4,
                        *master.blocks_.elements_.
                         super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar1]);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  int                       nblocks = 4*world.size();

  diy::FileStorage          storage("./DIY.XXXXXX");

  diy::Master               master(world,
                                   -1,
                                   2,
                                   &create_block,
                                   &destroy_block,
                                   &storage,
                                   &save_block,
                                   &load_block);

  srand(static_cast<unsigned int>(time(NULL)));

  //diy::ContiguousAssigner   assigner(world.size(), nblocks);
  diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  for (int gid = 0; gid < nblocks; ++gid)
    if (assigner.rank(gid) == world.rank())
      master.add(gid, new Block, new diy::Link);

  bool all_done = false;
  while (!all_done)
  {
    master.foreach(&flip_coin);
    master.exchange();
    all_done = master.proxy(master.loaded_block()).read<int>();
  }

  if (world.rank() == 0)
    std::cout << "Total iterations: " << master.block<Block>(master.loaded_block())->count << std::endl;
}